

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

string * __thiscall
cmsys::SystemInformationImplementation::ParseValueFromKStat_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformationImplementation *this,char *arguments)

{
  byte bVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  SystemInformationImplementation *this_00;
  char cVar6;
  long lVar7;
  vector<const_char_*,_std::allocator<const_char_*>_> args;
  string lastArg;
  string buffer;
  string command;
  string val;
  undefined1 local_e8 [8];
  char **ppcStack_e0;
  char **local_d8;
  long *local_c8 [2];
  long local_b8 [2];
  string local_a8;
  char *local_88 [2];
  _Alloc_hider local_78 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Alloc_hider local_38;
  
  this_00 = (SystemInformationImplementation *)local_e8;
  local_e8 = (undefined1  [8])0x0;
  local_d8 = (char **)0x0;
  ppcStack_e0 = (char **)0x0;
  local_88[0] = "kstat";
  std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)local_e8,(iterator)0x0,local_88);
  local_88[0] = "-p";
  if (ppcStack_e0 == local_d8) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)local_e8,(iterator)ppcStack_e0,
               local_88);
  }
  else {
    *ppcStack_e0 = "-p";
    ppcStack_e0 = ppcStack_e0 + 1;
  }
  std::__cxx11::string::string((string *)local_88,arguments,(allocator *)local_c8);
  uVar3 = std::__cxx11::string::find((char)local_88,0x20);
  if (uVar3 != 0xffffffffffffffff) {
    do {
      cVar6 = (char)local_88;
      uVar4 = std::__cxx11::string::find(cVar6,0x22);
      uVar5 = std::__cxx11::string::find(cVar6,0x22);
      if (uVar4 < uVar5 && uVar5 != 0xffffffffffffffff) {
        do {
          if (uVar4 < uVar3 && uVar3 < uVar5) goto LAB_00480733;
          uVar4 = std::__cxx11::string::find(cVar6,0x22);
          uVar5 = std::__cxx11::string::find(cVar6,0x22);
        } while ((uVar4 < uVar5) && (uVar5 != 0xffffffffffffffff));
      }
      std::__cxx11::string::substr((ulong)local_c8,(ulong)local_88);
      while (uVar3 = std::__cxx11::string::find((char)local_c8,0x22), uVar3 != 0xffffffffffffffff) {
        std::__cxx11::string::erase((ulong)local_c8,uVar3);
      }
      local_a8._M_dataplus._M_p = (pointer)local_c8[0];
      if (ppcStack_e0 == local_d8) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)local_e8,(iterator)ppcStack_e0
                   ,(char **)&local_a8);
      }
      else {
        *ppcStack_e0 = (char *)local_c8[0];
        ppcStack_e0 = ppcStack_e0 + 1;
      }
      if (local_c8[0] != local_b8) {
        operator_delete(local_c8[0],local_b8[0] + 1);
      }
LAB_00480733:
      uVar3 = std::__cxx11::string::find(cVar6,0x20);
    } while (uVar3 != 0xffffffffffffffff);
  }
  std::__cxx11::string::substr((ulong)local_c8,(ulong)local_88);
  local_a8._M_dataplus._M_p = (pointer)local_c8[0];
  if (ppcStack_e0 == local_d8) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)local_e8,(iterator)ppcStack_e0,
               (char **)&local_a8);
  }
  else {
    *ppcStack_e0 = (char *)local_c8[0];
    ppcStack_e0 = ppcStack_e0 + 1;
  }
  local_a8._M_dataplus._M_p = (pointer)0x0;
  if (ppcStack_e0 == local_d8) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)local_e8,(iterator)ppcStack_e0,
               (char **)&local_a8);
  }
  else {
    *ppcStack_e0 = (char *)0x0;
    ppcStack_e0 = ppcStack_e0 + 1;
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_48,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_e8);
  RunProcess_abi_cxx11_
            (&local_a8,this_00,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_48);
  if ((void *)local_48._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_48._M_allocated_capacity,(long)local_38._M_p - local_48._0_8_);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  lVar7 = local_a8._M_string_length - 1;
  if (lVar7 != 0) {
    do {
      bVar1 = local_a8._M_dataplus._M_p[lVar7];
      if (bVar1 < 0xd) {
        if (bVar1 != 10) {
          if (bVar1 == 9) break;
LAB_00480873:
          pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
          local_68._M_allocated_capacity = (size_type)local_58;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_68,pcVar2,pcVar2 + __return_storage_ptr__->_M_string_length);
          std::__cxx11::string::_M_replace_aux
                    ((ulong)__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,'\x01'
                    );
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,local_68._M_allocated_capacity);
          if ((_Alloc_hider *)local_68._M_allocated_capacity != local_58) {
            operator_delete((void *)local_68._M_allocated_capacity,(ulong)(local_58[0]._M_p + 1));
          }
        }
      }
      else if (bVar1 != 0xd) {
        if (bVar1 != 0x20) goto LAB_00480873;
        break;
      }
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1));
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  if ((_Alloc_hider *)local_88[0] != local_78) {
    operator_delete(local_88[0],(ulong)(local_78[0]._M_p + 1));
  }
  if (local_e8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_e8,(long)local_d8 - (long)local_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformationImplementation::ParseValueFromKStat(
  const char* arguments)
{
  std::vector<const char*> args;
  args.clear();
  args.push_back("kstat");
  args.push_back("-p");

  std::string command = arguments;
  size_t start = std::string::npos;
  size_t pos = command.find(' ', 0);
  while (pos != std::string::npos) {
    bool inQuotes = false;
    // Check if we are between quotes
    size_t b0 = command.find('"', 0);
    size_t b1 = command.find('"', b0 + 1);
    while (b0 != std::string::npos && b1 != std::string::npos && b1 > b0) {
      if (pos > b0 && pos < b1) {
        inQuotes = true;
        break;
      }
      b0 = command.find('"', b1 + 1);
      b1 = command.find('"', b0 + 1);
    }

    if (!inQuotes) {
      std::string arg = command.substr(start + 1, pos - start - 1);

      // Remove the quotes if any
      size_t quotes = arg.find('"');
      while (quotes != std::string::npos) {
        arg.erase(quotes, 1);
        quotes = arg.find('"');
      }
      args.push_back(arg.c_str());
      start = pos;
    }
    pos = command.find(' ', pos + 1);
  }
  std::string lastArg = command.substr(start + 1, command.size() - start - 1);
  args.push_back(lastArg.c_str());

  args.push_back(0);

  std::string buffer = this->RunProcess(args);

  std::string value = "";
  for (size_t i = buffer.size() - 1; i > 0; i--) {
    if (buffer[i] == ' ' || buffer[i] == '\t') {
      break;
    }
    if (buffer[i] != '\n' && buffer[i] != '\r') {
      std::string val = value;
      value = buffer[i];
      value += val;
    }
  }
  return value;
}